

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::acceptorFixtureLogOn_ResetOnLogonHelper::~acceptorFixtureLogOn_ResetOnLogonHelper
          (acceptorFixtureLogOn_ResetOnLogonHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)this);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(acceptorFixture, LogOn_ResetOnLogon) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(0, 0, 31);

  UtcTimeStamp time;
  object->setResetOnLogon(true);

  object->logon();
  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  CHECK(object->isLoggedOn());
}